

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegalizeJSInterface.cpp
# Opt level: O3

Function * __thiscall
wasm::anon_unknown_0::LegalizeJSInterface::getFunctionOrImport
          (LegalizeJSInterface *this,Module *module,Name name,Type params,Type results)

{
  char *pcVar1;
  Module *this_00;
  _Head_base<0UL,_wasm::Function_*,_false> _Var2;
  pointer ppFVar3;
  Name name_00;
  Signature sig;
  Name name_01;
  undefined1 local_e8 [8];
  ImportInfo info;
  HeapType local_50;
  Type local_48;
  Module *local_40;
  _Head_base<0UL,_wasm::Function_*,_false> local_38;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> import;
  
  name_00.super_IString.str._M_str = name.super_IString.str._M_len;
  name_00.super_IString.str._M_len = (size_t)module;
  local_48.id = params.id;
  _Var2._M_head_impl = Module::getFunctionOrNull((Module *)this,name_00);
  if (_Var2._M_head_impl == (Function *)0x0) {
    local_40 = (Module *)this;
    ImportInfo::ImportInfo((ImportInfo *)local_e8,(Module *)this);
    for (ppFVar3 = (pointer)info.importedGlobals.
                            super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
        ppFVar3 !=
        info.importedFunctions.
        super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_start; ppFVar3 = ppFVar3 + 1) {
      _Var2._M_head_impl = *ppFVar3;
      if ((((_Var2._M_head_impl)->super_Importable).module.super_IString.str._M_str == DAT_010b0e58)
         && (((_Var2._M_head_impl)->super_Importable).base.super_IString.str._M_str ==
             (char *)name_00.super_IString.str._M_str)) goto LAB_0091badf;
    }
    sig.results.id = local_48.id;
    sig.params.id = name.super_IString.str._M_str;
    HeapType::HeapType(&local_50,sig);
    info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    name_01.super_IString.str._M_str = (char *)module;
    name_01.super_IString.str._M_len = (size_t)&local_38;
    Builder::makeFunction
              (name_01,name_00.super_IString.str._M_str,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_50.id,
               (Expression *)
               &info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = local_40;
    if (info.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(info.importedTags.
                      super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      -(long)info.importedTags.
                             super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
    }
    _Var2._M_head_impl = local_38._M_head_impl;
    pcVar1 = DAT_010b0e58;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_len = ENV;
    ((local_38._M_head_impl)->super_Importable).module.super_IString.str._M_str = pcVar1;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_len = (size_t)module;
    ((local_38._M_head_impl)->super_Importable).base.super_IString.str._M_str =
         (char *)name_00.super_IString.str._M_str;
    Module::addFunction(this_00,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                                &local_38);
    if (local_38._M_head_impl != (Function *)0x0) {
      std::default_delete<wasm::Function>::operator()
                ((default_delete<wasm::Function> *)&local_38,local_38._M_head_impl);
    }
LAB_0091badf:
    if (info.importedMemories.super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(info.importedMemories.
                      super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      (long)info.importedTags.
                            super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)info.importedMemories.
                            super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (info.importedTables.super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(info.importedTables.
                      super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      (long)info.importedMemories.
                            super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)info.importedTables.
                            super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (info.importedFunctions.
        super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(info.importedFunctions.
                      super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)info.importedTables.
                            super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)info.importedFunctions.
                            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (info.importedGlobals.super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(info.importedGlobals.
                      super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                      (long)info.importedFunctions.
                            super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)info.importedGlobals.
                            super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    if (info.wasm != (Module *)0x0) {
      operator_delete(info.wasm,
                      (long)info.importedGlobals.
                            super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)info.wasm);
    }
  }
  return _Var2._M_head_impl;
}

Assistant:

static Function*
  getFunctionOrImport(Module* module, Name name, Type params, Type results) {
    // First look for the function by name
    if (Function* f = module->getFunctionOrNull(name)) {
      return f;
    }
    // Then see if its already imported
    ImportInfo info(*module);
    if (Function* f = info.getImportedFunction(ENV, name)) {
      return f;
    }
    // Failing that create a new function import.
    auto import = Builder::makeFunction(name, Signature(params, results), {});
    import->module = ENV;
    import->base = name;
    auto* ret = import.get();
    module->addFunction(std::move(import));
    return ret;
  }